

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void usage(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  fprintf(_stderr,
          "usage: %s [options] <in.gb>\n  -h,--help            help\n  -j,--joypad FILE     read joypad input from FILE\n  -f,--frames N        run for N frames (default: %u)\n  -o,--output FILE     output PPM file to FILE\n  -a,--animate         output an image every frame\n  -s,--seed SEED       random seed used for initializing RAM\n  -P,--palette PAL     use a builtin palette for DMG\n     --force-dmg       force running as a DMG (original gameboy)\n     --sgb-border         draw the super gameboy border\n"
          ,*argv,0x3c);
  return;
}

Assistant:

void usage(int argc, char** argv) {
  static const char usage[] =
      "usage: %s [options] <in.gb>\n"
      "  -h,--help            help\n"
#ifdef TESTER_DEBUGGER
      "  -t,--trace           trace each instruction\n"
      "  -l,--log S=N         set log level for system S to N\n"
#endif
      "  -j,--joypad FILE     read joypad input from FILE\n"
      "  -f,--frames N        run for N frames (default: %u)\n"
      "  -o,--output FILE     output PPM file to FILE\n"
      "  -a,--animate         output an image every frame\n"
#ifdef TESTER_DEBUGGER
      "     --print-ops       print execution count of each opcode\n"
      "     --print-ops-limit max opcodes to print\n"
      "     --profile         print execution count of each opcode\n"
      "     --profile-limit   max opcodes to print\n"
#endif
      "  -s,--seed SEED       random seed used for initializing RAM\n"
      "  -P,--palette PAL     use a builtin palette for DMG\n"
      "     --force-dmg       force running as a DMG (original gameboy)\n"
      "     --sgb-border         draw the super gameboy border\n";

  PRINT_ERROR(usage, argv[0], DEFAULT_FRAMES);

#ifdef TESTER_DEBUGGER
  emulator_print_log_systems();
#endif
}